

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O2

bool __thiscall CBanDB::Read(CBanDB *this,banmap_t *banSet)

{
  long lVar1;
  string_view source_file;
  pointer pbVar2;
  bool bVar3;
  mapped_type *bans_json;
  Logger *pLVar4;
  path *__p;
  char *in_R8;
  pointer args;
  long in_FS_OFFSET;
  string_view str;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  char *in_stack_fffffffffffffe90;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  *in_stack_fffffffffffffe98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  errors;
  string local_128;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  settings;
  string local_78;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = std::filesystem::exists((path *)this);
  if (bVar3) {
    std::filesystem::__cxx11::path::string((string *)&settings,(path *)this);
    log_msg._M_string_length = CONCAT62(log_msg._M_string_length._2_6_,0x2622);
    in_R8 = (char *)0x99;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp";
    source_file_00._M_len = 0x53;
    logging_function_00._M_str = "Read";
    logging_function_00._M_len = 4;
    log_msg._M_dataplus._M_p = (pointer)&settings;
    LogPrintf_<std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
              (logging_function_00,source_file_00,0x99,
               IPC|I2P|QT|LIBEVENT|REINDEX|SELECTCOINS|ESTIMATEFEE|WALLETDB|BENCH,(Level)&log_msg,
               in_stack_fffffffffffffe90,in_stack_fffffffffffffe98);
    std::__cxx11::string::~string((string *)&settings);
  }
  __p = &this->m_banlist_json;
  bVar3 = std::filesystem::exists(&__p->super_path);
  if (bVar3) {
    settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &settings._M_t._M_impl.super__Rb_tree_header._M_header;
    settings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    settings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    errors.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    errors.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    errors.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    settings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar3 = common::ReadSettings(__p,&settings,&errors);
    pbVar2 = errors.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&log_msg,"banned_nets",(allocator<char> *)&local_78);
      bans_json = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
                  ::operator[](&settings,&log_msg);
      BanMapFromJson(bans_json,banSet);
      std::__cxx11::string::~string((string *)&log_msg);
      bVar3 = true;
    }
    else {
      for (args = errors.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; args != pbVar2; args = args + 1) {
        std::filesystem::__cxx11::path::string(&local_128,&__p->super_path);
        pLVar4 = LogInstance();
        bVar3 = BCLog::Logger::Enabled(pLVar4);
        if (bVar3) {
          log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
          log_msg._M_string_length = 0;
          log_msg.field_2._M_local_buf[0] = '\0';
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    (&local_78,(tinyformat *)"Cannot load banlist %s: %s\n",(char *)&local_128,args,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&log_msg,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          pLVar4 = LogInstance();
          local_78._M_dataplus._M_p = (pointer)0x53;
          local_78._M_string_length = 0xca0cf7;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp"
          ;
          source_file._M_len = 0x53;
          str._M_str = log_msg._M_dataplus._M_p;
          str._M_len = log_msg._M_string_length;
          logging_function._M_str = "Read";
          logging_function._M_len = 4;
          in_R8 = "Read";
          BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0xa5,ALL,Info);
          std::__cxx11::string::~string((string *)&log_msg);
        }
        std::__cxx11::string::~string((string *)&local_128);
      }
      bVar3 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&errors);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
    ::~_Rb_tree(&settings._M_t);
  }
  else {
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CBanDB::Read(banmap_t& banSet)
{
    if (fs::exists(m_banlist_dat)) {
        LogPrintf("banlist.dat ignored because it can only be read by " PACKAGE_NAME " version 22.x. Remove %s to silence this warning.\n", fs::quoted(fs::PathToString(m_banlist_dat)));
    }
    // If the JSON banlist does not exist, then recreate it
    if (!fs::exists(m_banlist_json)) {
        return false;
    }

    std::map<std::string, common::SettingsValue> settings;
    std::vector<std::string> errors;

    if (!common::ReadSettings(m_banlist_json, settings, errors)) {
        for (const auto& err : errors) {
            LogPrintf("Cannot load banlist %s: %s\n", fs::PathToString(m_banlist_json), err);
        }
        return false;
    }

    try {
        BanMapFromJson(settings[JSON_KEY], banSet);
    } catch (const std::runtime_error& e) {
        LogPrintf("Cannot parse banlist %s: %s\n", fs::PathToString(m_banlist_json), e.what());
        return false;
    }

    return true;
}